

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkBase.cpp
# Opt level: O2

void __thiscall chrono::ChLinkBase::ArchiveIN(ChLinkBase *this,ChArchiveIn *marchive)

{
  ChNameValue<bool> local_60;
  ChNameValue<bool> local_48;
  ChNameValue<bool> local_30;
  
  ChArchiveIn::VersionRead<chrono::ChLinkBase>(marchive);
  ChPhysicsItem::ArchiveIN(&this->super_ChPhysicsItem,marchive);
  local_30._value = (bool *)&(this->super_ChPhysicsItem).field_0x74;
  local_30._name = "disabled";
  local_30._flags = '\0';
  ChArchiveIn::operator>>(marchive,&local_30);
  local_48._value = (bool *)&(this->super_ChPhysicsItem).field_0x75;
  local_48._name = "valid";
  local_48._flags = '\0';
  ChArchiveIn::operator>>(marchive,&local_48);
  local_60._value = (bool *)&(this->super_ChPhysicsItem).field_0x76;
  local_60._name = "broken";
  local_60._flags = '\0';
  ChArchiveIn::operator>>(marchive,&local_60);
  return;
}

Assistant:

void ChLinkBase::ArchiveIN(ChArchiveIn& marchive) {
    // version number
    /*int version =*/ marchive.VersionRead<ChLinkBase>();

    // deserialize parent class
    ChPhysicsItem::ArchiveIN(marchive);

    // deserialize all member data:
    marchive >> CHNVP(disabled);
    marchive >> CHNVP(valid);
    marchive >> CHNVP(broken);
}